

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser_cpp_test.cc
# Opt level: O0

int __thiscall
ctemplate_htmlparser::HtmlparserCppTest::NameToId
          (HtmlparserCppTest *this,IdNameMap *list,string *name)

{
  int iVar1;
  string *name_local;
  IdNameMap *list_local;
  HtmlparserCppTest *this_local;
  
  name_local = (string *)list;
  if (list == (IdNameMap *)0x0) {
    fprintf(_stderr,"Check failed: %s\n","list != NULL");
    exit(1);
  }
  while( true ) {
    if (*(long *)(name_local + 8) == 0) {
      fprintf(_stderr,"Check failed: %s\n","false");
      exit(1);
    }
    iVar1 = std::__cxx11::string::compare((char *)name);
    if (iVar1 == 0) break;
    name_local = name_local + 0x10;
  }
  return *(int *)name_local;
}

Assistant:

int HtmlparserCppTest::NameToId(const struct IdNameMap *list,
                                const string &name) {
  CHECK(list != NULL);
  while (list->name) {
    if (name.compare(list->name) == 0) {
      return list->id;
    }
    list++;
  }
  LOG(FATAL) << "Unknown name";
}